

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enet.h
# Opt level: O0

int enet_socket_set_option(ENetSocket socket,ENetSocketOption option,int value)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  long local_38;
  timeval timeVal_1;
  timeval timeVal;
  int result;
  int value_local;
  ENetSocketOption option_local;
  ENetSocket socket_local;
  
  timeVal.tv_usec._0_4_ = -1;
  if (option - ENET_SOCKOPT_NONBLOCK < 9 || option == ENET_SOCKOPT_IPV6_V6ONLY) {
    timeVal.tv_usec._4_4_ = value;
    switch((long)&switchD_0010700e::switchdataD_0010c01c +
           (long)(int)(&switchD_0010700e::switchdataD_0010c01c)[option - ENET_SOCKOPT_NONBLOCK]) {
    case 0x107010:
      uVar1 = 0;
      if (value != 0) {
        uVar1 = 0x800;
      }
      uVar2 = fcntl(socket,3);
      timeVal.tv_usec._0_4_ = fcntl(socket,4,(ulong)(uVar1 | uVar2 & 0xfffff7ff));
      break;
    case 0x107059:
      timeVal.tv_usec._0_4_ = setsockopt(socket,1,6,(void *)((long)&timeVal.tv_usec + 4),4);
      break;
    case 0x10707d:
      timeVal.tv_usec._0_4_ = setsockopt(socket,1,2,(void *)((long)&timeVal.tv_usec + 4),4);
      break;
    case 0x1070a1:
      timeVal.tv_usec._0_4_ = setsockopt(socket,1,8,(void *)((long)&timeVal.tv_usec + 4),4);
      break;
    case 0x1070c5:
      timeVal.tv_usec._0_4_ = setsockopt(socket,1,7,(void *)((long)&timeVal.tv_usec + 4),4);
      break;
    case 0x1070e9:
      timeVal_1.tv_usec = (__suseconds_t)(value / 1000);
      timeVal.tv_sec = (__time_t)((value % 1000) * 1000);
      timeVal.tv_usec._0_4_ = setsockopt(socket,1,0x14,&timeVal_1.tv_usec,0x10);
      break;
    case 0x107135:
      local_38 = (long)(value / 1000);
      timeVal_1.tv_sec = (__time_t)((value % 1000) * 1000);
      timeVal.tv_usec._0_4_ = setsockopt(socket,1,0x15,&local_38,0x10);
      break;
    case 0x10717e:
      timeVal.tv_usec._0_4_ = setsockopt(socket,6,1,(void *)((long)&timeVal.tv_usec + 4),4);
      break;
    case 0x10719f:
      timeVal.tv_usec._0_4_ = setsockopt(socket,0x29,0x1a,(void *)((long)&timeVal.tv_usec + 4),4);
      break;
    case 0x1071c0:
      goto switchD_0010700e_caseD_1071c0;
    }
  }
  else {
switchD_0010700e_caseD_1071c0:
  }
  iVar3 = 0;
  if ((int)timeVal.tv_usec == -1) {
    iVar3 = -1;
  }
  return iVar3;
}

Assistant:

int enet_socket_set_option(ENetSocket socket, ENetSocketOption option, int value) {
	int result = -1;

	switch (option) {
	case ENET_SOCKOPT_NONBLOCK:
		result = fcntl(socket, F_SETFL, (value ? O_NONBLOCK : 0) | (fcntl(socket, F_GETFL) & ~O_NONBLOCK));

		break;

	case ENET_SOCKOPT_BROADCAST:
		result = setsockopt(socket, SOL_SOCKET, SO_BROADCAST, (char*)&value, sizeof(int));

		break;

	case ENET_SOCKOPT_REUSEADDR:
		result = setsockopt(socket, SOL_SOCKET, SO_REUSEADDR, (char*)&value, sizeof(int));

		break;

	case ENET_SOCKOPT_RCVBUF:
		result = setsockopt(socket, SOL_SOCKET, SO_RCVBUF, (char*)&value, sizeof(int));

		break;

	case ENET_SOCKOPT_SNDBUF:
		result = setsockopt(socket, SOL_SOCKET, SO_SNDBUF, (char*)&value, sizeof(int));

		break;

	case ENET_SOCKOPT_RCVTIMEO: {
		struct timeval timeVal;

		timeVal.tv_sec = value / 1000;
		timeVal.tv_usec = (value % 1000) * 1000;
		result = setsockopt(socket, SOL_SOCKET, SO_RCVTIMEO, (char*)&timeVal, sizeof(struct timeval));

		break;
	}

	case ENET_SOCKOPT_SNDTIMEO: {
		struct timeval timeVal;

		timeVal.tv_sec = value / 1000;
		timeVal.tv_usec = (value % 1000) * 1000;
		result = setsockopt(socket, SOL_SOCKET, SO_SNDTIMEO, (char*)&timeVal, sizeof(struct timeval));

		break;
	}

	case ENET_SOCKOPT_NODELAY:
		result = setsockopt(socket, IPPROTO_TCP, TCP_NODELAY, (char*)&value, sizeof(int));

		break;

	case ENET_SOCKOPT_IPV6_V6ONLY:
		result = setsockopt(socket, IPPROTO_IPV6, IPV6_V6ONLY, (char*)&value, sizeof(int));

		break;

	default:
		break;
	}

	return result == -1 ? -1 : 0;
}